

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Theory.cpp
# Opt level: O2

Option<Kernel::RationalConstantType> *
Kernel::parseExponentInteger
          (Option<Kernel::RationalConstantType> *__return_storage_ptr__,string *number,
          char *exponentChars)

{
  MaybeUninit<Kernel::RationalConstantType> *this;
  int iVar1;
  bool bVar2;
  long lVar3;
  int exp;
  IntegerConstantType local_d0;
  string local_c0;
  IntegerConstantType local_a0;
  RationalConstantType local_90;
  Option<Kernel::RationalConstantType> base;
  RationalConstantType local_48;
  
  lVar3 = std::__cxx11::string::find_first_of((char *)number,(ulong)exponentChars);
  if (lVar3 != -1) {
    std::__cxx11::string::substr((ulong)&local_c0,(ulong)number);
    parseRat(&base,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    exp = 0;
    std::__cxx11::string::substr((ulong)&local_c0,(ulong)number);
    bVar2 = Lib::Int::stringToInt(local_c0._M_dataplus._M_p,&exp);
    if (bVar2) {
      std::__cxx11::string::~string((string *)&local_c0);
      iVar1 = exp;
      if (base.super_OptionBase<Kernel::RationalConstantType>._isSome == true) {
        this = &base.super_OptionBase<Kernel::RationalConstantType>._elem;
        if (exp < 0) {
          IntegerConstantType::IntegerConstantType(&local_d0,10);
          IntegerConstantType::operator^(&local_a0,(unsigned_long)&local_d0);
          RationalConstantType::RationalConstantType(&local_90,&local_a0);
          RationalConstantType::operator/
                    ((RationalConstantType *)&local_c0,(RationalConstantType *)this,&local_90);
        }
        else {
          RationalConstantType::RationalConstantType(&local_48,(RationalConstantType *)this);
          IntegerConstantType::IntegerConstantType(&local_d0,10);
          IntegerConstantType::operator^(&local_90._num,(unsigned_long)&local_d0);
          operator*((RationalConstantType *)&local_c0,&local_48,&local_90._num);
        }
        Lib::OptionBase<Kernel::RationalConstantType>::OptionBase
                  (&__return_storage_ptr__->super_OptionBase<Kernel::RationalConstantType>,
                   (RationalConstantType *)&local_c0);
        RationalConstantType::~RationalConstantType((RationalConstantType *)&local_c0);
        if (iVar1 < 0) {
          RationalConstantType::~RationalConstantType(&local_90);
          IntegerConstantType::~IntegerConstantType(&local_a0);
          IntegerConstantType::~IntegerConstantType(&local_d0);
        }
        else {
          IntegerConstantType::~IntegerConstantType(&local_90._num);
          IntegerConstantType::~IntegerConstantType(&local_d0);
          RationalConstantType::~RationalConstantType(&local_48);
        }
        Lib::OptionBase<Kernel::RationalConstantType>::~OptionBase
                  (&base.super_OptionBase<Kernel::RationalConstantType>);
        return __return_storage_ptr__;
      }
    }
    else {
      std::__cxx11::string::~string((string *)&local_c0);
    }
    Lib::OptionBase<Kernel::RationalConstantType>::~OptionBase
              (&base.super_OptionBase<Kernel::RationalConstantType>);
  }
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_OptionBase<Kernel::RationalConstantType>)._elem._elem + 8)
       = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_OptionBase<Kernel::RationalConstantType>)._elem._elem +
   0x10) = 0;
  *(undefined8 *)&__return_storage_ptr__->super_OptionBase<Kernel::RationalConstantType> = 0;
  *(undefined8 *)
   &(__return_storage_ptr__->super_OptionBase<Kernel::RationalConstantType>)._elem._elem = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_OptionBase<Kernel::RationalConstantType>)._elem._elem +
   0x18) = 0;
  return __return_storage_ptr__;
}

Assistant:

Option<RationalConstantType> parseExponentInteger(std::string const& number, const char* exponentChars) {
  auto i = number.find_first_of(exponentChars);
  if (i != std::string::npos) {
    auto base = parseRat(number.substr(0, i));
    int exp = 0;
    if (Int::stringToInt(number.substr(i + 1).c_str(), exp) && base.isSome()) {
      return some(
          exp >= 0 ? (*base) * (IntegerConstantType(10) ^ (unsigned long)exp)
                   : (*base) / RationalConstantType((IntegerConstantType(10) ^ (unsigned long)abs(exp))));
    }
  }
  return {};
}